

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void basic_test(void)

{
  fdb_encryption_key *__s;
  size_t *psVar1;
  __atomic_base<unsigned_long> handle;
  fdb_status fVar2;
  int iVar3;
  char *pcVar4;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  fdb_kvs_handle *handle_00;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_config *__ptr;
  size_t bodylen;
  ulong uVar8;
  fdb_kvs_handle *fconfig_00;
  long lVar9;
  __atomic_base<unsigned_long> fconfig_01;
  fdb_config *pfVar10;
  uint uVar11;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar12;
  fdb_file_info *unaff_R12;
  fdb_file_handle **ptr_fhandle;
  fdb_kvs_handle *unaff_R13;
  btree *unaff_R14;
  fdb_kvs_handle *unaff_R15;
  char *kvs_config_00;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_kvs_handle *db_rdonly;
  fdb_file_handle *dbfile_rdonly;
  fdb_kvs_config kvs_config;
  fdb_file_info info;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_11e08;
  fdb_kvs_handle *pfStack_11e00;
  fdb_file_handle *pfStack_11df8;
  timeval tStack_11df0;
  fdb_kvs_config fStack_11de0;
  fdb_config fStack_11dc8;
  char acStack_11cd0 [256];
  char *pcStack_11bd0;
  fdb_config *pfStack_11bc8;
  fdb_config *pfStack_11bc0;
  fdb_file_handle *pfStack_11bb0;
  fdb_kvs_handle *pfStack_11ba8;
  fdb_kvs_config fStack_11ba0;
  timeval tStack_11b88;
  char acStack_11b78 [264];
  fdb_config fStack_11a70;
  char acStack_11978 [256];
  char acStack_11878 [264];
  char *pcStack_11770;
  fdb_file_handle **ppfStack_11768;
  fdb_kvs_handle *pfStack_11760;
  fdb_config *pfStack_11758;
  fdb_kvs_config *pfStack_11750;
  fdb_kvs_handle *pfStack_11748;
  fdb_kvs_handle *pfStack_11730;
  fdb_file_handle *pfStack_11728;
  fdb_iterator *pfStack_11720;
  timeval tStack_11718;
  fdb_kvs_config fStack_11708;
  fdb_file_handle *apfStack_116f0 [32];
  fdb_config fStack_115f0;
  fdb_config fStack_114e8;
  char acStack_113f0 [264];
  fdb_config *pfStack_112e8;
  fdb_file_info *pfStack_112e0;
  fdb_kvs_handle *pfStack_112d8;
  fdb_config *pfStack_112d0;
  fdb_kvs_handle *pfStack_112c8;
  fdb_kvs_handle *pfStack_112c0;
  fdb_file_handle *pfStack_112b0;
  fdb_kvs_handle *pfStack_112a8;
  fdb_doc *pfStack_112a0;
  undefined1 auStack_11298 [40];
  fdb_seqnum_t fStack_11270;
  uint64_t uStack_11268;
  void *pvStack_11260;
  fdb_config *pfStack_11258;
  uint64_t uStack_11250;
  fdb_kvs_config fStack_11248;
  timeval tStack_11230;
  undefined1 auStack_11220 [72];
  fdb_config fStack_111d8;
  char acStack_110d8 [256];
  fdb_config fStack_10fd8;
  fdb_config *pfStack_10ee0;
  fdb_config *pfStack_10ed8;
  fdb_doc *pfStack_10ec8;
  fdb_kvs_handle *pfStack_10ec0;
  fdb_file_handle *pfStack_10eb8;
  undefined1 auStack_10eb0 [40];
  fdb_seqnum_t fStack_10e88;
  uint64_t uStack_10e80;
  void *pvStack_10e78;
  fdb_config *pfStack_10e70;
  uint64_t uStack_10e68;
  fdb_kvs_config fStack_10e58;
  timeval tStack_10e40;
  uint8_t auStack_10e30 [256];
  fdb_config fStack_10d30;
  fdb_config fStack_10c30;
  fdb_config *pfStack_10b38;
  fdb_config *pfStack_10b30;
  fdb_file_handle *pfStack_10b20;
  fdb_kvs_handle *pfStack_10b18;
  size_t sStack_10b10;
  int *piStack_10b08;
  timeval tStack_10b00;
  fdb_config fStack_10af0;
  fdb_kvs_handle *pfStack_109f8;
  fdb_file_handle *pfStack_109e8;
  undefined1 auStack_109e0 [48];
  fdb_config fStack_109b0;
  fdb_file_info fStack_108b8;
  undefined1 auStack_10870 [272];
  fdb_file_info *pfStack_10760;
  fdb_kvs_handle *pfStack_10758;
  size_t *psStack_10750;
  fdb_kvs_handle *pfStack_10748;
  fdb_kvs_handle *pfStack_10740;
  __atomic_base<unsigned_long> _Stack_10738;
  fdb_file_handle *pfStack_10730;
  size_t sStack_10728;
  void *pvStack_10720;
  fdb_kvs_config fStack_10718;
  timeval tStack_10700;
  fdb_kvs_handle afStack_106f0 [126];
  undefined1 uStack_679;
  fdb_config *pfStack_670;
  btree *pbStack_668;
  fdb_file_handle *pfStack_660;
  fdb_kvs_handle *pfStack_658;
  fdb_kvs_config fStack_650;
  timeval tStack_638;
  fdb_config fStack_628;
  fdb_kvs_handle *pfStack_530;
  undefined1 local_520 [16];
  fdb_kvs_handle *local_510;
  fdb_kvs_handle *local_508;
  btree_kv_ops *local_500;
  undefined1 local_4f8 [104];
  fdb_doc *local_490;
  fdb_file_info local_488;
  timeval local_440;
  undefined1 local_430 [504];
  fdb_kvs_handle local_238;
  
  pfStack_530 = (fdb_kvs_handle *)0x10f30c;
  gettimeofday(&local_440,(__timezone_ptr_t)0x0);
  pfStack_530 = (fdb_kvs_handle *)0x10f311;
  memleak_start();
  local_520._0_8_ = (fdb_kvs_handle *)0x0;
  pfStack_530 = (fdb_kvs_handle *)0x10f326;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_530 = (fdb_kvs_handle *)0x10f32b;
  pcVar4 = fdb_get_lib_version();
  if (pcVar4 == (char *)0x0) {
    pfStack_530 = (fdb_kvs_handle *)0x10f335;
    basic_test();
LAB_0010f335:
    pfStack_530 = (fdb_kvs_handle *)0x10f354;
    __assert_fail("version != __null && strlen(version) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x37,"void basic_test()");
  }
  if (*pcVar4 == '\0') {
    pfStack_530 = (fdb_kvs_handle *)0x10f361;
    basic_test();
    if ((extraout_RAX & 1) != 0) goto LAB_0010f335;
  }
  fconfig_00 = (fdb_kvs_handle *)local_430;
  pfStack_530 = (fdb_kvs_handle *)0x10f375;
  fdb_get_default_config();
  pfStack_530 = (fdb_kvs_handle *)0x10f382;
  fdb_get_default_kvs_config();
  local_430._16_8_ = (void *)0x400;
  local_430[0x20] = '\x01';
  local_430[0x2f] = '\0';
  local_430._28_4_ = 1;
  local_430._36_4_ = 0;
  pfStack_530 = (fdb_kvs_handle *)0x10f3b4;
  fVar2 = fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",(fdb_config *)fconfig_00);
  if (fVar2 == FDB_RESULT_NO_SUCH_FILE) {
    fconfig_00 = (fdb_kvs_handle *)0xfffffffd;
    pfStack_530 = (fdb_kvs_handle *)0x10f3c6;
    pcVar4 = fdb_error_msg(FDB_RESULT_NO_SUCH_FILE);
    pfStack_530 = (fdb_kvs_handle *)0x10f3d5;
    iVar3 = strcmp(pcVar4,"no such file");
    if (iVar3 != 0) {
      pfStack_530 = (fdb_kvs_handle *)0x10f3e0;
      basic_test();
    }
    local_430._36_4_ = 2;
    pfStack_530 = (fdb_kvs_handle *)0x10f400;
    fVar2 = fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",(fdb_config *)local_430);
    if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0010fd81;
    local_430._36_4_ = 3;
    pfStack_530 = (fdb_kvs_handle *)0x10f429;
    fVar2 = fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",(fdb_config *)local_430);
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_0010fd86;
    fconfig_00 = (fdb_kvs_handle *)0xffffffec;
    pfStack_530 = (fdb_kvs_handle *)0x10f43b;
    pcVar4 = fdb_error_msg(FDB_RESULT_INVALID_CONFIG);
    pfStack_530 = (fdb_kvs_handle *)0x10f44a;
    iVar3 = strcmp(pcVar4,"invalid configuration");
    if (iVar3 != 0) {
      pfStack_530 = (fdb_kvs_handle *)0x10f455;
      basic_test();
    }
    local_430._36_4_ = 1;
    pfStack_530 = (fdb_kvs_handle *)0x10f475;
    fVar2 = fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",(fdb_config *)local_430);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd8b;
    pfStack_530 = (fdb_kvs_handle *)0x10f486;
    pcVar4 = fdb_error_msg(FDB_RESULT_SUCCESS);
    pfStack_530 = (fdb_kvs_handle *)0x10f495;
    iVar3 = strcmp(pcVar4,"success");
    if (iVar3 != 0) {
      pfStack_530 = (fdb_kvs_handle *)0x10f4a0;
      basic_test();
    }
    pfStack_530 = (fdb_kvs_handle *)0x10f4aa;
    pcVar4 = fdb_get_file_version((fdb_file_handle *)local_520._8_8_);
    if (pcVar4 == (char *)0x0) {
      pfStack_530 = (fdb_kvs_handle *)0x10f4b4;
      basic_test();
LAB_0010f4b4:
      pfStack_530 = (fdb_kvs_handle *)0x10f4d3;
      __assert_fail("file_version != __null && strlen(file_version) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x57,"void basic_test()");
    }
    if (*pcVar4 == '\0') {
      pfStack_530 = (fdb_kvs_handle *)0x10f4e0;
      basic_test();
      if ((extraout_RAX_00 & 1) != 0) goto LAB_0010f4b4;
    }
    pfStack_530 = (fdb_kvs_handle *)0x10f4f1;
    fdb_close((fdb_file_handle *)local_520._8_8_);
    pfStack_530 = (fdb_kvs_handle *)0x10f4fd;
    system("rm -rf  dummy* > errorlog.txt");
    pfStack_530 = (fdb_kvs_handle *)0x10f514;
    fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",(fdb_config *)local_430);
    fconfig_00 = (fdb_kvs_handle *)&local_510;
    pfStack_530 = (fdb_kvs_handle *)0x10f52c;
    fdb_kvs_open_default
              ((fdb_file_handle *)local_520._8_8_,(fdb_kvs_handle **)fconfig_00,
               (fdb_kvs_config *)(local_4f8 + 0x58));
    pfStack_530 = (fdb_kvs_handle *)0x10f542;
    fVar2 = fdb_set_log_callback(local_510,logCallbackFunc,"basic_test");
    handle_00 = unaff_R13;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd90;
    unaff_R12 = (fdb_file_info *)0x0;
    uVar8 = 0;
    do {
      __s = &local_238.config.encryption_key;
      pfStack_530 = (fdb_kvs_handle *)0x10f56a;
      sprintf((char *)__s,"key%d",uVar8 & 0xffffffff);
      pfStack_530 = (fdb_kvs_handle *)0x10f582;
      sprintf((char *)&local_238,"meta%d",uVar8 & 0xffffffff);
      pfStack_530 = (fdb_kvs_handle *)0x10f59a;
      sprintf(local_430 + 0xf8,"body%d",uVar8 & 0xffffffff);
      unaff_R15 = (fdb_kvs_handle *)(local_4f8 + (long)unaff_R12);
      pfStack_530 = (fdb_kvs_handle *)0x10f5aa;
      handle_00 = (fdb_kvs_handle *)strlen((char *)__s);
      unaff_RBP = &local_238;
      pfStack_530 = (fdb_kvs_handle *)0x10f5bd;
      unaff_R14 = (btree *)strlen((char *)unaff_RBP);
      pfStack_530 = (fdb_kvs_handle *)0x10f5cd;
      sVar5 = strlen(local_430 + 0xf8);
      pfStack_530 = (fdb_kvs_handle *)0x10f5f2;
      fdb_doc_create((fdb_doc **)unaff_R15,&local_238.config.encryption_key,(size_t)handle_00,
                     unaff_RBP,(size_t)unaff_R14,local_430 + 0xf8,sVar5);
      pfStack_530 = (fdb_kvs_handle *)0x10f601;
      fdb_set(local_510,*(fdb_doc **)(local_4f8 + uVar8 * 8));
      uVar8 = uVar8 + 1;
      unaff_R12 = (fdb_file_info *)((long)unaff_R12 + 8);
    } while (uVar8 != 10);
    fconfig_00 = (fdb_kvs_handle *)local_520;
    pfStack_530 = (fdb_kvs_handle *)0x10f63e;
    fdb_doc_create((fdb_doc **)fconfig_00,*(void **)(local_4f8._40_8_ + 0x20),
                   *(size_t *)local_4f8._40_8_,*(btree_kv_ops **)(local_4f8._40_8_ + 0x38),
                   *(bid_t *)(local_4f8._40_8_ + 8),(void *)0x0,0);
    pfStack_530 = (fdb_kvs_handle *)0x10f64b;
    fVar2 = fdb_del(local_510,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd95;
    pfStack_530 = (fdb_kvs_handle *)0x10f65d;
    fdb_doc_free((fdb_doc *)local_520._0_8_);
    local_520._0_8_ = (fdb_kvs_handle *)0x0;
    pfStack_530 = (fdb_kvs_handle *)0x10f672;
    fdb_commit((fdb_file_handle *)local_520._8_8_,'\0');
    pfStack_530 = (fdb_kvs_handle *)0x10f687;
    fdb_get_file_info((fdb_file_handle *)local_520._8_8_,&local_488);
    if (local_488.doc_count != 9) {
      pfStack_530 = (fdb_kvs_handle *)0x10f69b;
      basic_test();
    }
    if (local_488.deleted_count != 1) {
      pfStack_530 = (fdb_kvs_handle *)0x10f6b3;
      basic_test();
    }
    if (local_488.space_used == 0) {
      pfStack_530 = (fdb_kvs_handle *)0x10f6cb;
      basic_test();
    }
    if ((fdb_compaction_callback)local_488.num_kv_stores != (fdb_compaction_callback)0x1) {
      pfStack_530 = (fdb_kvs_handle *)0x10f6e3;
      basic_test();
    }
    fconfig_00 = (fdb_kvs_handle *)local_520;
    pfStack_530 = (fdb_kvs_handle *)0x10f70c;
    fdb_doc_create((fdb_doc **)fconfig_00,*(void **)(local_4f8._40_8_ + 0x20),
                   *(size_t *)local_4f8._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_530 = (fdb_kvs_handle *)0x10f719;
    fVar2 = fdb_get_metaonly(local_510,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd9a;
    if (*(char *)(local_520._0_8_ + 0x48) == '\0') {
      pfStack_530 = (fdb_kvs_handle *)0x10f736;
      basic_test();
    }
    fconfig_00 = (fdb_kvs_handle *)local_520._0_8_;
    unaff_R14 = *(btree **)(local_520._0_8_ + 0x38);
    unaff_R15 = *(fdb_kvs_handle **)(local_4f8._40_8_ + 0x38);
    pfStack_530 = (fdb_kvs_handle *)0x10f757;
    iVar3 = bcmp(unaff_R14,unaff_R15,(size_t)((fdb_kvs_config *)local_520._0_8_)->custom_cmp);
    if (iVar3 != 0) goto LAB_0010fd9f;
    pfStack_530 = (fdb_kvs_handle *)0x10f767;
    fdb_doc_free((fdb_doc *)fconfig_00);
    local_520._0_8_ = (fdb_kvs_handle *)0x0;
    fconfig_00 = (fdb_kvs_handle *)&local_510;
    pfStack_530 = (fdb_kvs_handle *)0x10f77d;
    fdb_kvs_close(local_510);
    unaff_R14 = (btree *)(local_520 + 8);
    pfStack_530 = (fdb_kvs_handle *)0x10f78a;
    fdb_close((fdb_file_handle *)local_520._8_8_);
    pfStack_530 = (fdb_kvs_handle *)0x10f7a1;
    fdb_open((fdb_file_handle **)unaff_R14,"./dummy1",(fdb_config *)local_430);
    pfStack_530 = (fdb_kvs_handle *)0x10f7b4;
    fdb_kvs_open_default
              ((fdb_file_handle *)local_520._8_8_,(fdb_kvs_handle **)fconfig_00,
               (fdb_kvs_config *)(local_4f8 + 0x58));
    pfStack_530 = (fdb_kvs_handle *)0x10f7ca;
    fVar2 = fdb_set_log_callback(local_510,logCallbackFunc,"basic_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fdaa;
    unaff_R15 = &local_238;
    handle_00 = (fdb_kvs_handle *)(local_430 + 0xf8);
    unaff_R12 = (fdb_file_info *)0x0;
    uVar8 = 0;
    do {
      pfStack_530 = (fdb_kvs_handle *)0x10f7fa;
      sprintf((char *)unaff_R15,"meta2%d",uVar8 & 0xffffffff);
      pfStack_530 = (fdb_kvs_handle *)0x10f80d;
      sprintf((char *)handle_00,"body2%d",uVar8 & 0xffffffff);
      pfStack_530 = (fdb_kvs_handle *)0x10f81d;
      sVar5 = strlen((char *)unaff_R15);
      pfStack_530 = (fdb_kvs_handle *)0x10f828;
      sVar6 = strlen((char *)handle_00);
      pfStack_530 = (fdb_kvs_handle *)0x10f83c;
      fdb_doc_update((fdb_doc **)(local_4f8 + (long)unaff_R12),unaff_R15,sVar5,handle_00,sVar6);
      pfStack_530 = (fdb_kvs_handle *)0x10f84b;
      fdb_set(local_510,*(fdb_doc **)(local_4f8 + uVar8 * 8));
      uVar8 = uVar8 + 1;
      unaff_R12 = (fdb_file_info *)((long)unaff_R12 + 8);
    } while (uVar8 == 1);
    fconfig_00 = (fdb_kvs_handle *)0x0;
    pfStack_530 = (fdb_kvs_handle *)0x10f866;
    fdb_commit((fdb_file_handle *)local_520._8_8_,'\0');
    do {
      pfStack_530 = (fdb_kvs_handle *)0x10f88f;
      fdb_doc_create((fdb_doc **)local_520,
                     (void *)(*(size_t **)(local_4f8 + (long)fconfig_00 * 8))[4],
                     **(size_t **)(local_4f8 + (long)fconfig_00 * 8),(void *)0x0,0,(void *)0x0,0);
      pfStack_530 = (fdb_kvs_handle *)0x10f89e;
      fVar2 = fdb_get(local_510,(fdb_doc *)local_520._0_8_);
      unaff_RBP = (fdb_kvs_handle *)local_520._0_8_;
      pfVar12 = (fdb_kvs_handle *)(ulong)(uint)fVar2;
      if (fconfig_00 == (fdb_kvs_handle *)0x5) {
        unaff_RBP = pfVar12;
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010fd57;
        pfStack_530 = (fdb_kvs_handle *)0x10f8b6;
        pcVar4 = fdb_error_msg(FDB_RESULT_KEY_NOT_FOUND);
        pfStack_530 = (fdb_kvs_handle *)0x10f8c5;
        iVar3 = strcmp(pcVar4,"key not found");
        if (iVar3 != 0) {
          pfStack_530 = (fdb_kvs_handle *)0x10f8d0;
          basic_test();
        }
      }
      else {
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
        unaff_R12 = *(fdb_file_info **)(local_520._0_8_ + 0x38);
        unaff_R15 = *(fdb_kvs_handle **)(local_4f8 + (long)fconfig_00 * 8);
        handle_00 = (fdb_kvs_handle *)unaff_R15->staletree;
        pfStack_530 = (fdb_kvs_handle *)0x10f8fb;
        iVar3 = bcmp(unaff_R12,handle_00,(size_t)((fdb_kvs_config *)local_520._0_8_)->custom_cmp);
        if (iVar3 != 0) goto LAB_0010fd4c;
        unaff_R12 = (fdb_file_info *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)unaff_RBP + 0x40))->
                    seqtree;
        handle_00 = (fdb_kvs_handle *)(unaff_R15->field_6).seqtree;
        pfStack_530 = (fdb_kvs_handle *)0x10f91a;
        iVar3 = bcmp(unaff_R12,handle_00,(size_t)(unaff_RBP->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0010fd3c;
      }
      pfStack_530 = (fdb_kvs_handle *)0x10f92c;
      fdb_doc_free((fdb_doc *)local_520._0_8_);
      local_520._0_8_ = (fdb_kvs_handle *)0x0;
      fconfig_00 = (fdb_kvs_handle *)&(fconfig_00->kvs_config).field_0x1;
    } while (fconfig_00 != (fdb_kvs_handle *)0xa);
    pfStack_530 = (fdb_kvs_handle *)0x10f953;
    fdb_compact((fdb_file_handle *)local_520._8_8_,"./dummy2");
    fconfig_00 = (fdb_kvs_handle *)0x0;
    unaff_R13 = handle_00;
    do {
      pfStack_530 = (fdb_kvs_handle *)0x10f97e;
      fdb_doc_create((fdb_doc **)local_520,
                     (void *)(*(size_t **)(local_4f8 + (long)fconfig_00 * 8))[4],
                     **(size_t **)(local_4f8 + (long)fconfig_00 * 8),(void *)0x0,0,(void *)0x0,0);
      pfStack_530 = (fdb_kvs_handle *)0x10f98d;
      fVar2 = fdb_get(local_510,(fdb_doc *)local_520._0_8_);
      handle_00 = (fdb_kvs_handle *)local_520._0_8_;
      if (fconfig_00 == (fdb_kvs_handle *)0x5) {
        handle_00 = unaff_R13;
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010fd77;
      }
      else {
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd67;
        unaff_R15 = *(fdb_kvs_handle **)(local_520._0_8_ + 0x38);
        unaff_RBP = *(fdb_kvs_handle **)(local_4f8 + (long)fconfig_00 * 8);
        unaff_R12 = (fdb_file_info *)unaff_RBP->staletree;
        pfStack_530 = (fdb_kvs_handle *)0x10f9c6;
        iVar3 = bcmp(unaff_R15,unaff_R12,(size_t)((fdb_kvs_config *)local_520._0_8_)->custom_cmp);
        if (iVar3 != 0) goto LAB_0010fd6c;
        unaff_R15 = (fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)handle_00 + 0x40))->
                    seqtree;
        unaff_R12 = (fdb_file_info *)(unaff_RBP->field_6).seqtree;
        pfStack_530 = (fdb_kvs_handle *)0x10f9e5;
        iVar3 = bcmp(unaff_R15,unaff_R12,(size_t)(handle_00->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0010fd5c;
      }
      pfStack_530 = (fdb_kvs_handle *)0x10f9f7;
      fdb_doc_free((fdb_doc *)local_520._0_8_);
      local_520._0_8_ = (fdb_kvs_handle *)0x0;
      fconfig_00 = (fdb_kvs_handle *)&(fconfig_00->kvs_config).field_0x1;
      unaff_R13 = handle_00;
    } while (fconfig_00 != (fdb_kvs_handle *)0xa);
    unaff_R14 = (btree *)local_520;
    fconfig_00 = (fdb_kvs_handle *)0x3dc;
    unaff_R15 = (fdb_kvs_handle *)0x0;
    do {
      local_520._0_8_ = (fdb_kvs_handle *)0x0;
      pfStack_530 = (fdb_kvs_handle *)0x10fa36;
      fdb_doc_create((fdb_doc **)unaff_R14,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
      unaff_R12 = (fdb_file_info *)&(unaff_R15->kvs_config).field_0x1;
      *(fdb_file_info **)(local_520._0_8_ + 0x28) = unaff_R12;
      pfStack_530 = (fdb_kvs_handle *)0x10fa4d;
      fVar2 = fdb_get_byseq(local_510,(fdb_doc *)local_520._0_8_);
      if (((fdb_kvs_handle *)0xa < unaff_R15) ||
         (((uint)unaff_R15 < 10 && ((0x3dcU >> ((uint)unaff_R15 & 0x1f) & 1) != 0)))) {
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010fa67;
        pfStack_530 = (fdb_kvs_handle *)0x10fd3c;
        basic_test();
LAB_0010fd3c:
        pfStack_530 = (fdb_kvs_handle *)0x10fd47;
        basic_test();
        pfVar12 = unaff_RBP;
LAB_0010fd47:
        unaff_RBP = pfVar12;
        pfStack_530 = (fdb_kvs_handle *)0x10fd4c;
        basic_test();
LAB_0010fd4c:
        pfStack_530 = (fdb_kvs_handle *)0x10fd57;
        basic_test();
LAB_0010fd57:
        pfStack_530 = (fdb_kvs_handle *)0x10fd5c;
        basic_test();
LAB_0010fd5c:
        pfStack_530 = (fdb_kvs_handle *)0x10fd67;
        basic_test();
        unaff_R13 = handle_00;
LAB_0010fd67:
        handle_00 = unaff_R13;
        pfStack_530 = (fdb_kvs_handle *)0x10fd6c;
        basic_test();
LAB_0010fd6c:
        pfStack_530 = (fdb_kvs_handle *)0x10fd77;
        basic_test();
        unaff_R13 = handle_00;
LAB_0010fd77:
        unaff_R14 = (btree *)local_520;
        pfStack_530 = (fdb_kvs_handle *)0x10fd7c;
        basic_test();
        goto LAB_0010fd7c;
      }
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) {
        pfStack_530 = (fdb_kvs_handle *)0x10fa8f;
        basic_test();
        break;
      }
LAB_0010fa67:
      pfStack_530 = (fdb_kvs_handle *)0x10fa71;
      fdb_doc_free((fdb_doc *)local_520._0_8_);
      local_520._0_8_ = (fdb_kvs_handle *)0x0;
      unaff_R15 = (fdb_kvs_handle *)unaff_R12;
    } while (unaff_R12 != (fdb_file_info *)0xd);
    fconfig_00 = (fdb_kvs_handle *)local_520;
    pfStack_530 = (fdb_kvs_handle *)0x10fabb;
    fdb_doc_create((fdb_doc **)fconfig_00,*(void **)(local_4f8._40_8_ + 0x20),
                   *(size_t *)local_4f8._40_8_,*(btree_kv_ops **)(local_4f8._40_8_ + 0x38),
                   *(bid_t *)(local_4f8._40_8_ + 8),(void *)0x0,0);
    pfStack_530 = (fdb_kvs_handle *)0x10fac8;
    fVar2 = fdb_set(local_510,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fdaf;
    fconfig_00 = (fdb_kvs_handle *)local_520;
    pfStack_530 = (fdb_kvs_handle *)0x10fadd;
    fdb_doc_free((fdb_doc *)local_520._0_8_);
    unaff_R14 = (btree *)0x0;
    local_520._0_8_ = (fdb_kvs_handle *)0x0;
    pfStack_530 = (fdb_kvs_handle *)0x10faef;
    fdb_commit((fdb_file_handle *)local_520._8_8_,'\0');
    pfStack_530 = (fdb_kvs_handle *)0x10fb0f;
    fdb_doc_create((fdb_doc **)fconfig_00,*(void **)(local_4f8._40_8_ + 0x20),
                   *(size_t *)local_4f8._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_530 = (fdb_kvs_handle *)0x10fb1c;
    fVar2 = fdb_get(local_510,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fdb4;
    pfStack_530 = (fdb_kvs_handle *)0x10fb3f;
    iVar3 = bcmp(*(btree **)(local_520._0_8_ + 0x38),*(btree_kv_ops **)(local_4f8._40_8_ + 0x38),
                 (size_t)((fdb_kvs_config *)local_520._0_8_)->custom_cmp);
    if (iVar3 != 0) {
      pfStack_530 = (fdb_kvs_handle *)0x10fb52;
      basic_test();
    }
    if (((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_520._0_8_ + 0x40))->seqtree !=
        (btree *)0x0) {
      pfStack_530 = (fdb_kvs_handle *)0x10fb68;
      basic_test();
    }
    if (((fdb_kvs_config *)local_520._0_8_)->custom_cmp_param != (void *)0x0) {
      pfStack_530 = (fdb_kvs_handle *)0x10fb7e;
      basic_test();
    }
    pfStack_530 = (fdb_kvs_handle *)0x10fb88;
    fdb_doc_free((fdb_doc *)local_520._0_8_);
    local_520._0_8_ = (fdb_kvs_handle *)0x0;
    local_430._36_4_ = 2;
    pfStack_530 = (fdb_kvs_handle *)0x10fbb1;
    fVar2 = fdb_open((fdb_file_handle **)&local_500,"./dummy2",(fdb_config *)local_430);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fdb9;
    pfStack_530 = (fdb_kvs_handle *)0x10fbd0;
    fVar2 = fdb_kvs_open_default
                      ((fdb_file_handle *)local_500,&local_508,(fdb_kvs_config *)(local_4f8 + 0x58))
    ;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fdbe;
    fconfig_00 = (fdb_kvs_handle *)local_520;
    pfStack_530 = (fdb_kvs_handle *)0x10fc01;
    fdb_doc_create((fdb_doc **)fconfig_00,*(void **)(local_4f8._0_8_ + 0x20),
                   (size_t)*(fdb_kvs_handle **)local_4f8._0_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_530 = (fdb_kvs_handle *)0x10fc0e;
    fVar2 = fdb_get(local_508,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fdc3;
    pfStack_530 = (fdb_kvs_handle *)0x10fc2e;
    fVar2 = fdb_set_log_callback(local_508,logCallbackFunc,"basic_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fdc8;
    pfStack_530 = (fdb_kvs_handle *)0x10fc48;
    fVar2 = fdb_set(local_508,local_490);
    if (fVar2 != FDB_RESULT_RONLY_VIOLATION) goto LAB_0010fdcd;
    fconfig_00 = (fdb_kvs_handle *)0xfffffff6;
    pfStack_530 = (fdb_kvs_handle *)0x10fc5a;
    pcVar4 = fdb_error_msg(FDB_RESULT_RONLY_VIOLATION);
    pfStack_530 = (fdb_kvs_handle *)0x10fc69;
    iVar3 = strcmp(pcVar4,"database is read-only");
    if (iVar3 != 0) {
      pfStack_530 = (fdb_kvs_handle *)0x10fc74;
      basic_test();
    }
    pfStack_530 = (fdb_kvs_handle *)0x10fc80;
    fVar2 = fdb_commit((fdb_file_handle *)local_500,'\0');
    if (fVar2 == FDB_RESULT_RONLY_VIOLATION) {
      pfStack_530 = (fdb_kvs_handle *)0x10fc93;
      fdb_doc_free((fdb_doc *)local_520._0_8_);
      local_520._0_8_ = (fdb_doc *)0x0;
      pfStack_530 = (fdb_kvs_handle *)0x10fca6;
      fdb_kvs_close(local_508);
      pfStack_530 = (fdb_kvs_handle *)0x10fcb0;
      fdb_close((fdb_file_handle *)local_500);
      lVar9 = 0;
      do {
        pfStack_530 = (fdb_kvs_handle *)0x10fcbc;
        fdb_doc_free(*(fdb_doc **)(local_4f8 + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 10);
      pfStack_530 = (fdb_kvs_handle *)0x10fcd6;
      fdb_compact((fdb_file_handle *)local_520._8_8_,"./dummy3");
      pfStack_530 = (fdb_kvs_handle *)0x10fce0;
      fdb_kvs_close(local_510);
      pfStack_530 = (fdb_kvs_handle *)0x10fcea;
      fdb_close((fdb_file_handle *)local_520._8_8_);
      pfStack_530 = (fdb_kvs_handle *)0x10fcef;
      fdb_shutdown();
      pfStack_530 = (fdb_kvs_handle *)0x10fcf4;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (basic_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_530 = (fdb_kvs_handle *)0x10fd25;
      fprintf(_stderr,pcVar4,"basic test");
      return;
    }
  }
  else {
LAB_0010fd7c:
    pfStack_530 = (fdb_kvs_handle *)0x10fd81;
    basic_test();
LAB_0010fd81:
    pfStack_530 = (fdb_kvs_handle *)0x10fd86;
    basic_test();
LAB_0010fd86:
    pfStack_530 = (fdb_kvs_handle *)0x10fd8b;
    basic_test();
LAB_0010fd8b:
    pfStack_530 = (fdb_kvs_handle *)0x10fd90;
    basic_test();
    handle_00 = unaff_R13;
LAB_0010fd90:
    pfStack_530 = (fdb_kvs_handle *)0x10fd95;
    basic_test();
LAB_0010fd95:
    pfStack_530 = (fdb_kvs_handle *)0x10fd9a;
    basic_test();
LAB_0010fd9a:
    pfStack_530 = (fdb_kvs_handle *)0x10fd9f;
    basic_test();
LAB_0010fd9f:
    pfStack_530 = (fdb_kvs_handle *)0x10fdaa;
    basic_test();
LAB_0010fdaa:
    pfStack_530 = (fdb_kvs_handle *)0x10fdaf;
    basic_test();
LAB_0010fdaf:
    pfStack_530 = (fdb_kvs_handle *)0x10fdb4;
    basic_test();
LAB_0010fdb4:
    pfStack_530 = (fdb_kvs_handle *)0x10fdb9;
    basic_test();
LAB_0010fdb9:
    pfStack_530 = (fdb_kvs_handle *)0x10fdbe;
    basic_test();
LAB_0010fdbe:
    pfStack_530 = (fdb_kvs_handle *)0x10fdc3;
    basic_test();
LAB_0010fdc3:
    pfStack_530 = (fdb_kvs_handle *)0x10fdc8;
    basic_test();
LAB_0010fdc8:
    pfStack_530 = (fdb_kvs_handle *)0x10fdcd;
    basic_test();
LAB_0010fdcd:
    pfStack_530 = (fdb_kvs_handle *)0x10fdd2;
    basic_test();
  }
  pfStack_530 = (fdb_kvs_handle *)init_test;
  basic_test();
  pbStack_668 = (btree *)0x10fdeb;
  pfStack_530 = fconfig_00;
  gettimeofday(&tStack_638,(__timezone_ptr_t)0x0);
  pbStack_668 = (btree *)0x10fdf0;
  memleak_start();
  pbStack_668 = (btree *)0x10fdfd;
  fdb_get_default_config();
  pbStack_668 = (btree *)0x10fe07;
  fdb_get_default_kvs_config();
  pbStack_668 = (btree *)0x10fe13;
  system("rm -rf  dummy* > errorlog.txt");
  pbStack_668 = (btree *)0x10fe1b;
  fVar2 = fdb_init(&fStack_628);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pbStack_668 = (btree *)0x10fe37;
    fVar2 = fdb_open(&pfStack_660,"./dummy1",&fStack_628);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010feac;
    pbStack_668 = (btree *)0x10fe4e;
    fVar2 = fdb_kvs_open_default(pfStack_660,&pfStack_658,&fStack_650);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010feb1;
    pbStack_668 = (btree *)0x10fe5b;
    fVar2 = fdb_close(pfStack_660);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010feb6;
    pbStack_668 = (btree *)0x10fe64;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pbStack_668 = (btree *)0x10fe6d;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (init_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pbStack_668 = (btree *)0x10fe9e;
      fprintf(_stderr,pcVar4,"init test");
      return;
    }
  }
  else {
    pbStack_668 = (btree *)0x10feac;
    init_test();
LAB_0010feac:
    pbStack_668 = (btree *)0x10feb1;
    init_test();
LAB_0010feb1:
    pbStack_668 = (btree *)0x10feb6;
    init_test();
LAB_0010feb6:
    pbStack_668 = (btree *)0x10febb;
    init_test();
  }
  pbStack_668 = (btree *)set_get_max_keylen;
  init_test();
  pfStack_10740 = (fdb_kvs_handle *)0x10fed6;
  pfStack_670 = &fStack_628;
  pbStack_668 = unaff_R14;
  gettimeofday(&tStack_10700,(__timezone_ptr_t)0x0);
  pfStack_10740 = (fdb_kvs_handle *)0x10fedb;
  memleak_start();
  pfStack_10740 = (fdb_kvs_handle *)0x10fee5;
  fdb_get_default_kvs_config();
  fconfig_01._M_i = (__int_type)afStack_106f0;
  pfStack_10740 = (fdb_kvs_handle *)0x10fef2;
  fdb_get_default_config();
  afStack_106f0[0].kvs_config.create_if_missing = true;
  afStack_106f0[0].kvs_config._1_1_ = 0;
  pfStack_10740 = (fdb_kvs_handle *)0x10ff03;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_10740 = (fdb_kvs_handle *)0x10ff1d;
  memset(&afStack_106f0[0].config.num_bgflusher_threads,0x61,0xff80);
  uStack_679 = 0;
  pfStack_10740 = (fdb_kvs_handle *)0x10ff39;
  fVar2 = fdb_open(&pfStack_10730,"./dummy1",(fdb_config *)fconfig_01._M_i);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10740 = (fdb_kvs_handle *)0x10ff53;
    fVar2 = fdb_kvs_open_default(pfStack_10730,(fdb_kvs_handle **)&_Stack_10738,&fStack_10718);
    handle._M_i = _Stack_10738._M_i;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110023;
    psVar1 = &afStack_106f0[0].config.num_bgflusher_threads;
    pfStack_10740 = (fdb_kvs_handle *)0x10ff6f;
    sVar5 = strlen((char *)psVar1);
    pfStack_10740 = (fdb_kvs_handle *)0x10ff82;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,psVar1,sVar5,(void *)0x0,0);
    fconfig_01._M_i = handle._M_i;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110028;
    pfStack_10740 = (fdb_kvs_handle *)0x10ff95;
    fVar2 = fdb_get((fdb_kvs_handle *)_Stack_10738._M_i,(fdb_doc *)0x0);
    if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_0011002d;
    psVar1 = &afStack_106f0[0].config.num_bgflusher_threads;
    pfStack_10740 = (fdb_kvs_handle *)0x10ffb2;
    sVar5 = strlen((char *)psVar1);
    pfStack_10740 = (fdb_kvs_handle *)0x10ffca;
    fVar2 = fdb_get_kv((fdb_kvs_handle *)_Stack_10738._M_i,psVar1,sVar5,&pvStack_10720,&sStack_10728
                      );
    fconfig_01._M_i = _Stack_10738._M_i;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10740 = (fdb_kvs_handle *)0x10ffd8;
      fdb_close(pfStack_10730);
      pfStack_10740 = (fdb_kvs_handle *)0x10ffdd;
      fdb_shutdown();
      pfStack_10740 = (fdb_kvs_handle *)0x10ffe2;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (set_get_max_keylen()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_10740 = (fdb_kvs_handle *)0x110013;
      fprintf(_stderr,pcVar4,"set get max keylen");
      return;
    }
  }
  else {
    pfStack_10740 = (fdb_kvs_handle *)0x110023;
    set_get_max_keylen();
LAB_00110023:
    pfStack_10740 = (fdb_kvs_handle *)0x110028;
    set_get_max_keylen();
LAB_00110028:
    pfStack_10740 = (fdb_kvs_handle *)0x11002d;
    set_get_max_keylen();
LAB_0011002d:
    pfStack_10740 = (fdb_kvs_handle *)0x110032;
    set_get_max_keylen();
  }
  pcVar4 = (char *)&afStack_106f0[0].config.num_bgflusher_threads;
  pfStack_10740 = (fdb_kvs_handle *)config_test;
  set_get_max_keylen();
  pfStack_109f8 = (fdb_kvs_handle *)0x110054;
  auStack_10870._264_8_ = fconfig_01._M_i;
  pfStack_10760 = unaff_R12;
  pfStack_10758 = handle_00;
  psStack_10750 = (size_t *)pcVar4;
  pfStack_10748 = unaff_R15;
  pfStack_10740 = unaff_RBP;
  gettimeofday((timeval *)(auStack_109e0 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_109f8 = (fdb_kvs_handle *)0x110059;
  memleak_start();
  pfStack_109f8 = (fdb_kvs_handle *)0x110065;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_109f8 = (fdb_kvs_handle *)0x11006a;
  sVar7 = fdb_get_buffer_cache_used();
  if (sVar7 == 0) {
    fconfig_01._M_i = (__int_type)auStack_10870;
    pfStack_109f8 = (fdb_kvs_handle *)0x110083;
    fdb_get_default_config();
    pcVar4 = (char *)&fStack_109b0;
    pfStack_109f8 = (fdb_kvs_handle *)0x110098;
    memcpy(pcVar4,(void *)fconfig_01._M_i,0xf8);
    fStack_109b0.buffercache_size = 0xffffffffffffffff;
    pfStack_109f8 = (fdb_kvs_handle *)0x1100b4;
    fVar2 = fdb_open(&pfStack_109e8,"./dummy1",(fdb_config *)pcVar4);
    if (fVar2 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) goto LAB_0011030f;
    fconfig_01._M_i = (__int_type)auStack_10870;
    pfStack_109f8 = (fdb_kvs_handle *)0x1100cd;
    fdb_get_default_config();
    pcVar4 = (char *)&fStack_109b0;
    pfStack_109f8 = (fdb_kvs_handle *)0x1100e2;
    memcpy(pcVar4,(void *)fconfig_01._M_i,0xf8);
    fStack_109b0.max_writer_lock_prob = 0x78;
    pfStack_109f8 = (fdb_kvs_handle *)0x1100fe;
    fVar2 = fdb_open(&pfStack_109e8,"./dummy1",(fdb_config *)pcVar4);
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_00110314;
    fconfig_01._M_i = (__int_type)auStack_10870;
    pfStack_109f8 = (fdb_kvs_handle *)0x110117;
    fdb_get_default_config();
    pfStack_109f8 = (fdb_kvs_handle *)0x110129;
    memcpy(&fStack_109b0,(void *)fconfig_01._M_i,0xf8);
    pfStack_109f8 = (fdb_kvs_handle *)0x110133;
    fdb_get_default_kvs_config();
    unaff_RBP = (fdb_kvs_handle *)0x4;
    pcVar4 = "justonekv";
    unaff_R15 = (fdb_kvs_handle *)auStack_109e0;
    unaff_R12 = &fStack_108b8;
    do {
      pfStack_109f8 = (fdb_kvs_handle *)0x11015f;
      sprintf((char *)fconfig_01._M_i,"dummy%d",unaff_RBP);
      pfStack_109f8 = (fdb_kvs_handle *)0x110171;
      fVar2 = fdb_open(&pfStack_109e8,(char *)fconfig_01._M_i,&fStack_109b0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001102fb:
        pfStack_109f8 = (fdb_kvs_handle *)0x110300;
        config_test();
LAB_00110300:
        pfStack_109f8 = (fdb_kvs_handle *)0x110305;
        config_test();
LAB_00110305:
        pfStack_109f8 = (fdb_kvs_handle *)0x11030a;
        config_test();
        goto LAB_0011030a;
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x11018e;
      fVar2 = fdb_kvs_open(pfStack_109e8,(fdb_kvs_handle **)unaff_R15,"justonekv",
                           (fdb_kvs_config *)(auStack_109e0 + 8));
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_109f8 = (fdb_kvs_handle *)0x1102fb;
        config_test();
        goto LAB_001102fb;
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x11019b;
      handle_00 = (fdb_kvs_handle *)fdb_get_buffer_cache_used();
      pfStack_109f8 = (fdb_kvs_handle *)0x1101ab;
      fVar2 = fdb_get_file_info(pfStack_109e8,unaff_R12);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110305;
      if (fStack_108b8.file_size != fStack_109b0.blocksize * 7) {
        pfStack_109f8 = (fdb_kvs_handle *)0x110203;
        config_test();
      }
      if (handle_00 != (fdb_kvs_handle *)(ulong)(fStack_109b0.blocksize * 2)) {
        pfStack_109f8 = (fdb_kvs_handle *)0x110212;
        config_test();
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x1101df;
      fVar2 = fdb_close(pfStack_109e8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110300;
      uVar11 = (int)unaff_RBP - 1;
      unaff_RBP = (fdb_kvs_handle *)(ulong)uVar11;
    } while (uVar11 != 0);
    pfStack_109f8 = (fdb_kvs_handle *)0x11022b;
    fVar2 = fdb_open(&pfStack_109e8,auStack_10870,&fStack_109b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110319;
    pfStack_109f8 = (fdb_kvs_handle *)0x11024e;
    fVar2 = fdb_kvs_open(pfStack_109e8,(fdb_kvs_handle **)auStack_109e0,"justonekv",
                         (fdb_kvs_config *)(auStack_109e0 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011031e;
    pfStack_109f8 = (fdb_kvs_handle *)0x110279;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)auStack_109e0._0_8_,"key",3,"body",5);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_109f8 = (fdb_kvs_handle *)0x110286;
      sVar7 = fdb_get_buffer_cache_used();
      if (sVar7 != fStack_109b0.blocksize << 3) {
        pfStack_109f8 = (fdb_kvs_handle *)0x11029f;
        config_test();
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x1102a9;
      fdb_close(pfStack_109e8);
      pfStack_109f8 = (fdb_kvs_handle *)0x1102ae;
      fdb_shutdown();
      pfStack_109f8 = (fdb_kvs_handle *)0x1102b3;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x1102e4;
      fprintf(_stderr,pcVar4,"forestdb config test");
      return;
    }
  }
  else {
LAB_0011030a:
    pfStack_109f8 = (fdb_kvs_handle *)0x11030f;
    config_test();
LAB_0011030f:
    pfStack_109f8 = (fdb_kvs_handle *)0x110314;
    config_test();
LAB_00110314:
    pfStack_109f8 = (fdb_kvs_handle *)0x110319;
    config_test();
LAB_00110319:
    pfStack_109f8 = (fdb_kvs_handle *)0x11031e;
    config_test();
LAB_0011031e:
    pfStack_109f8 = (fdb_kvs_handle *)0x110323;
    config_test();
  }
  pfStack_109f8 = (fdb_kvs_handle *)delete_reopen_test;
  config_test();
  pfStack_10b30 = (fdb_config *)0x11033c;
  pfStack_109f8 = (fdb_kvs_handle *)fconfig_01._M_i;
  gettimeofday(&tStack_10b00,(__timezone_ptr_t)0x0);
  pfStack_10b30 = (fdb_config *)0x110341;
  memleak_start();
  pfStack_10b30 = (fdb_config *)0x11034d;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_10b30 = (fdb_config *)0x11035a;
  fdb_get_default_config();
  fStack_10af0.buffercache_size = 0;
  fStack_10af0.num_compactor_threads = 1;
  pfStack_10b30 = (fdb_config *)0x11037e;
  fVar2 = fdb_open(&pfStack_10b20,"./dummy3",&fStack_10af0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10b30 = (fdb_config *)0x110397;
    fVar2 = fdb_kvs_open_default(pfStack_10b20,&pfStack_10b18,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011058e;
    pfStack_10b30 = (fdb_config *)0x1103ae;
    fVar2 = fdb_begin_transaction(pfStack_10b20,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110593;
    pfStack_10b30 = (fdb_config *)0x1103d9;
    fVar2 = fdb_set_kv(pfStack_10b18,"foo",3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110598;
    pfStack_10b30 = (fdb_config *)0x1103ed;
    fVar2 = fdb_end_transaction(pfStack_10b20,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011059d;
    pfStack_10b30 = (fdb_config *)0x110415;
    fVar2 = fdb_get_kv(pfStack_10b18,"foo",3,&piStack_10b08,&sStack_10b10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a2;
    if (sStack_10b10 != 5) {
      pfStack_10b30 = (fdb_config *)0x11042f;
      delete_reopen_test();
    }
    if ((char)piStack_10b08[1] != 'e' || *piStack_10b08 != 0x756c6176) goto LAB_001105a7;
    pfStack_10b30 = (fdb_config *)0x11044f;
    fdb_free_block(piStack_10b08);
    pfStack_10b30 = (fdb_config *)0x11045e;
    fVar2 = fdb_begin_transaction(pfStack_10b20,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105ac;
    pfStack_10b30 = (fdb_config *)0x11047c;
    fVar2 = fdb_del_kv(pfStack_10b18,"foo",3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105b1;
    pfStack_10b30 = (fdb_config *)0x110490;
    fVar2 = fdb_end_transaction(pfStack_10b20,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105b6;
    pfStack_10b30 = (fdb_config *)0x1104b8;
    fVar2 = fdb_get_kv(pfStack_10b18,"foo",3,&piStack_10b08,&sStack_10b10);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105bb;
    pfStack_10b30 = (fdb_config *)0x1104cb;
    fVar2 = fdb_close(pfStack_10b20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105c0;
    pfStack_10b30 = (fdb_config *)0x1104e9;
    fVar2 = fdb_open(&pfStack_10b20,"./dummy3",&fStack_10af0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105c5;
    pfStack_10b30 = (fdb_config *)0x110502;
    fVar2 = fdb_kvs_open_default(pfStack_10b20,&pfStack_10b18,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105ca;
    pfStack_10b30 = (fdb_config *)0x11052a;
    fVar2 = fdb_get_kv(pfStack_10b18,"foo",3,&piStack_10b08,&sStack_10b10);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105cf;
    pfStack_10b30 = (fdb_config *)0x11053d;
    fVar2 = fdb_close(pfStack_10b20);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10b30 = (fdb_config *)0x11054a;
      fdb_shutdown();
      pfStack_10b30 = (fdb_config *)0x11054f;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_10b30 = (fdb_config *)0x110580;
      fprintf(_stderr,pcVar4,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    pfStack_10b30 = (fdb_config *)0x11058e;
    delete_reopen_test();
LAB_0011058e:
    pfStack_10b30 = (fdb_config *)0x110593;
    delete_reopen_test();
LAB_00110593:
    pfStack_10b30 = (fdb_config *)0x110598;
    delete_reopen_test();
LAB_00110598:
    pfStack_10b30 = (fdb_config *)0x11059d;
    delete_reopen_test();
LAB_0011059d:
    pfStack_10b30 = (fdb_config *)0x1105a2;
    delete_reopen_test();
LAB_001105a2:
    pfStack_10b30 = (fdb_config *)0x1105a7;
    delete_reopen_test();
LAB_001105a7:
    pfStack_10b30 = (fdb_config *)0x1105ac;
    delete_reopen_test();
LAB_001105ac:
    pfStack_10b30 = (fdb_config *)0x1105b1;
    delete_reopen_test();
LAB_001105b1:
    pfStack_10b30 = (fdb_config *)0x1105b6;
    delete_reopen_test();
LAB_001105b6:
    pfStack_10b30 = (fdb_config *)0x1105bb;
    delete_reopen_test();
LAB_001105bb:
    pfStack_10b30 = (fdb_config *)0x1105c0;
    delete_reopen_test();
LAB_001105c0:
    pfStack_10b30 = (fdb_config *)0x1105c5;
    delete_reopen_test();
LAB_001105c5:
    pfStack_10b30 = (fdb_config *)0x1105ca;
    delete_reopen_test();
LAB_001105ca:
    pfStack_10b30 = (fdb_config *)0x1105cf;
    delete_reopen_test();
LAB_001105cf:
    pfStack_10b30 = (fdb_config *)0x1105d4;
    delete_reopen_test();
  }
  pfStack_10b30 = (fdb_config *)deleted_doc_get_api_test;
  delete_reopen_test();
  pfStack_10ed8 = (fdb_config *)0x1105f2;
  pfStack_10b38 = &fStack_10af0;
  pfStack_10b30 = (fdb_config *)pcVar4;
  gettimeofday(&tStack_10e40,(__timezone_ptr_t)0x0);
  pfStack_10ed8 = (fdb_config *)0x1105f7;
  memleak_start();
  pfStack_10ed8 = (fdb_config *)0x110603;
  system("rm -rf  dummy* > errorlog.txt");
  uStack_10e68 = 0;
  auStack_10eb0._0_8_ = 0;
  auStack_10eb0._8_8_ = 0;
  auStack_10eb0._16_8_ = 0;
  auStack_10eb0._24_8_ = 0;
  uStack_10e80 = 0;
  pvStack_10e78 = (void *)0x0;
  auStack_10eb0._32_8_ = auStack_10e30;
  pfStack_10e70 = &fStack_10d30;
  fStack_10e88 = 0xffffffffffffffff;
  pfVar10 = &fStack_10c30;
  pfStack_10ed8 = (fdb_config *)0x110652;
  fdb_get_default_config();
  fStack_10c30.purging_interval = 1;
  fStack_10c30.seqtree_opt = '\x01';
  pfStack_10ed8 = (fdb_config *)0x110667;
  fdb_get_default_kvs_config();
  pfStack_10ed8 = (fdb_config *)0x11067b;
  fVar2 = fdb_open(&pfStack_10eb8,"./dummy1",pfVar10);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10ed8 = (fdb_config *)0x110699;
    fVar2 = fdb_kvs_open(pfStack_10eb8,&pfStack_10ec0,(char *)0x0,&fStack_10e58);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c4;
    builtin_memcpy(auStack_10e30,"key",4);
    pfVar10 = &fStack_10d30;
    fStack_10d30.chunksize = 0x6f62;
    fStack_10d30._2_2_ = 0x7964;
    fStack_10d30.blocksize._0_1_ = 0;
    pfStack_10ed8 = (fdb_config *)0x1106c6;
    auStack_10eb0._0_8_ = strlen((char *)auStack_10e30);
    pcVar4 = auStack_10eb0;
    pfStack_10ed8 = (fdb_config *)0x1106d6;
    auStack_10eb0._16_8_ = strlen((char *)pfVar10);
    pfStack_10ed8 = (fdb_config *)0x1106e7;
    fVar2 = fdb_set(pfStack_10ec0,(fdb_doc *)pcVar4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c9;
    pfStack_10ed8 = (fdb_config *)0x1106fe;
    fVar2 = fdb_commit(pfStack_10eb8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    pfStack_10ed8 = (fdb_config *)0x110715;
    fVar2 = fdb_del(pfStack_10ec0,(fdb_doc *)auStack_10eb0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d3;
    pfStack_10ed8 = (fdb_config *)0x11072c;
    fVar2 = fdb_commit(pfStack_10eb8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pfVar10 = (fdb_config *)&pfStack_10ec8;
    pfStack_10ed8 = (fdb_config *)0x11075e;
    fdb_doc_create((fdb_doc **)pfVar10,auStack_10e30,auStack_10eb0._0_8_,(void *)0x0,0,(void *)0x0,0
                  );
    pfStack_10ed8 = (fdb_config *)0x11076b;
    fVar2 = fdb_get_metaonly(pfStack_10ec0,pfStack_10ec8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    if (pfStack_10ec8->deleted == false) {
      pfStack_10ed8 = (fdb_config *)0x110788;
      deleted_doc_get_api_test();
    }
    pfStack_10ec8->deleted = false;
    pfStack_10ed8 = (fdb_config *)0x11079b;
    fVar2 = fdb_get_metaonly_byseq(pfStack_10ec0,pfStack_10ec8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e2;
    if (pfStack_10ec8->deleted == false) {
      pfStack_10ed8 = (fdb_config *)0x1107b8;
      deleted_doc_get_api_test();
    }
    pfStack_10ec8->deleted = false;
    pfStack_10ed8 = (fdb_config *)0x1107cb;
    fVar2 = fdb_get_byoffset(pfStack_10ec0,pfStack_10ec8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108e7;
    if (pfStack_10ec8->deleted == false) {
      pfStack_10ed8 = (fdb_config *)0x1107e9;
      deleted_doc_get_api_test();
    }
    pfStack_10ec8->deleted = false;
    pfStack_10ed8 = (fdb_config *)0x1107fc;
    fVar2 = fdb_get(pfStack_10ec0,pfStack_10ec8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ec;
    if (pfStack_10ec8->deleted == true) {
      pfStack_10ed8 = (fdb_config *)0x11081a;
      deleted_doc_get_api_test();
    }
    pfStack_10ec8->deleted = false;
    pfStack_10ed8 = (fdb_config *)0x11082d;
    fVar2 = fdb_get_byseq(pfStack_10ec0,pfStack_10ec8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f1;
    if (pfStack_10ec8->deleted == true) {
      pfStack_10ed8 = (fdb_config *)0x11084b;
      deleted_doc_get_api_test();
    }
    pfStack_10ed8 = (fdb_config *)0x110855;
    fdb_doc_free(pfStack_10ec8);
    pfStack_10ed8 = (fdb_config *)0x11085f;
    fVar2 = fdb_kvs_close(pfStack_10ec0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f6;
    pfStack_10ed8 = (fdb_config *)0x110871;
    fVar2 = fdb_close(pfStack_10eb8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10ed8 = (fdb_config *)0x11087e;
      fdb_shutdown();
      pfStack_10ed8 = (fdb_config *)0x110883;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_10ed8 = (fdb_config *)0x1108b4;
      fprintf(_stderr,pcVar4,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_10ed8 = (fdb_config *)0x1108c4;
    deleted_doc_get_api_test();
LAB_001108c4:
    pfStack_10ed8 = (fdb_config *)0x1108c9;
    deleted_doc_get_api_test();
LAB_001108c9:
    pfStack_10ed8 = (fdb_config *)0x1108ce;
    deleted_doc_get_api_test();
LAB_001108ce:
    pfStack_10ed8 = (fdb_config *)0x1108d3;
    deleted_doc_get_api_test();
LAB_001108d3:
    pfStack_10ed8 = (fdb_config *)0x1108d8;
    deleted_doc_get_api_test();
LAB_001108d8:
    pfStack_10ed8 = (fdb_config *)0x1108dd;
    deleted_doc_get_api_test();
LAB_001108dd:
    pfStack_10ed8 = (fdb_config *)0x1108e2;
    deleted_doc_get_api_test();
LAB_001108e2:
    pfStack_10ed8 = (fdb_config *)0x1108e7;
    deleted_doc_get_api_test();
LAB_001108e7:
    pfStack_10ed8 = (fdb_config *)0x1108ec;
    deleted_doc_get_api_test();
LAB_001108ec:
    pfStack_10ed8 = (fdb_config *)0x1108f1;
    deleted_doc_get_api_test();
LAB_001108f1:
    pfStack_10ed8 = (fdb_config *)0x1108f6;
    deleted_doc_get_api_test();
LAB_001108f6:
    pfStack_10ed8 = (fdb_config *)0x1108fb;
    deleted_doc_get_api_test();
  }
  pfStack_10ed8 = (fdb_config *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pfStack_112c0 = (fdb_kvs_handle *)0x110919;
  pfStack_10ee0 = pfVar10;
  pfStack_10ed8 = (fdb_config *)pcVar4;
  gettimeofday(&tStack_11230,(__timezone_ptr_t)0x0);
  pfStack_112c0 = (fdb_kvs_handle *)0x11091e;
  memleak_start();
  pfStack_112c0 = (fdb_kvs_handle *)0x11092a;
  system("rm -rf  dummy* > errorlog.txt");
  uStack_11250 = 0;
  auStack_11298._0_8_ = 0;
  auStack_11298._8_8_ = 0;
  auStack_11298._16_8_ = 0;
  auStack_11298._24_8_ = 0;
  uStack_11268 = 0;
  pvStack_11260 = (void *)0x0;
  auStack_11298._32_8_ = acStack_110d8;
  pfStack_11258 = &fStack_111d8;
  fStack_11270 = 0xffffffffffffffff;
  pfVar10 = &fStack_10fd8;
  pfStack_112c0 = (fdb_kvs_handle *)0x110979;
  fdb_get_default_config();
  fStack_10fd8.purging_interval = 0;
  pfStack_112c0 = (fdb_kvs_handle *)0x11098a;
  fdb_get_default_kvs_config();
  pfStack_112c0 = (fdb_kvs_handle *)0x11099e;
  fVar2 = fdb_open(&pfStack_112b0,"./dummy1",pfVar10);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_112c0 = (fdb_kvs_handle *)0x1109c1;
    fVar2 = fdb_kvs_open(pfStack_112b0,&pfStack_112a8,"main",&fStack_11248);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b41;
    acStack_110d8[0] = 'K';
    acStack_110d8[1] = '\0';
    pfVar10 = &fStack_111d8;
    fStack_111d8.chunksize = 0x6f62;
    fStack_111d8._2_2_ = 0x7964;
    fStack_111d8.blocksize._0_1_ = 0;
    pfStack_112c0 = (fdb_kvs_handle *)0x1109ed;
    sVar5 = strlen(acStack_110d8);
    auStack_11298._0_8_ = sVar5 + 1;
    pcVar4 = auStack_11298;
    pfStack_112c0 = (fdb_kvs_handle *)0x110a00;
    sVar5 = strlen((char *)pfVar10);
    auStack_11298._16_8_ = sVar5 + 1;
    pfStack_112c0 = (fdb_kvs_handle *)0x110a14;
    fVar2 = fdb_set(pfStack_112a8,(fdb_doc *)pcVar4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b46;
    pfStack_112c0 = (fdb_kvs_handle *)0x110a2b;
    fVar2 = fdb_del(pfStack_112a8,(fdb_doc *)auStack_11298);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4b;
    pfVar10 = (fdb_config *)&pfStack_112a0;
    pfStack_112c0 = (fdb_kvs_handle *)0x110a5a;
    fdb_doc_create((fdb_doc **)pfVar10,(void *)auStack_11298._32_8_,auStack_11298._0_8_,(void *)0x0,
                   0,(void *)0x0,0);
    pfStack_112c0 = (fdb_kvs_handle *)0x110a67;
    fVar2 = fdb_get(pfStack_112a8,pfStack_112a0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b50;
    pfStack_112c0 = (fdb_kvs_handle *)0x110a7a;
    fdb_doc_free(pfStack_112a0);
    pfStack_112c0 = (fdb_kvs_handle *)0x110a8c;
    fdb_get_file_info(pfStack_112b0,(fdb_file_info *)auStack_11220);
    pfVar10 = (fdb_config *)(auStack_11220 + 0x10);
    if (auStack_11220._16_8_ != 0) {
      pfStack_112c0 = (fdb_kvs_handle *)0x110aa2;
      deleted_doc_stat_test();
    }
    pfStack_112c0 = (fdb_kvs_handle *)0x110aae;
    fVar2 = fdb_commit(pfStack_112b0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b55;
    pcVar4 = auStack_11220;
    pfStack_112c0 = (fdb_kvs_handle *)0x110acb;
    fdb_get_file_info(pfStack_112b0,(fdb_file_info *)pcVar4);
    if (auStack_11220._16_8_ != 0) {
      pfStack_112c0 = (fdb_kvs_handle *)0x110ada;
      deleted_doc_stat_test();
    }
    pfStack_112c0 = (fdb_kvs_handle *)0x110ae4;
    fVar2 = fdb_kvs_close(pfStack_112a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5a;
    pfStack_112c0 = (fdb_kvs_handle *)0x110af2;
    fVar2 = fdb_close(pfStack_112b0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_112c0 = (fdb_kvs_handle *)0x110afb;
      fdb_shutdown();
      pfStack_112c0 = (fdb_kvs_handle *)0x110b00;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_112c0 = (fdb_kvs_handle *)0x110b31;
      fprintf(_stderr,pcVar4,"deleted doc stat test");
      return;
    }
  }
  else {
    pfStack_112c0 = (fdb_kvs_handle *)0x110b41;
    deleted_doc_stat_test();
LAB_00110b41:
    pfStack_112c0 = (fdb_kvs_handle *)0x110b46;
    deleted_doc_stat_test();
LAB_00110b46:
    pfStack_112c0 = (fdb_kvs_handle *)0x110b4b;
    deleted_doc_stat_test();
LAB_00110b4b:
    pfStack_112c0 = (fdb_kvs_handle *)0x110b50;
    deleted_doc_stat_test();
LAB_00110b50:
    pfStack_112c0 = (fdb_kvs_handle *)0x110b55;
    deleted_doc_stat_test();
LAB_00110b55:
    pfStack_112c0 = (fdb_kvs_handle *)0x110b5a;
    deleted_doc_stat_test();
LAB_00110b5a:
    pfStack_112c0 = (fdb_kvs_handle *)0x110b5f;
    deleted_doc_stat_test();
  }
  pfStack_112c0 = (fdb_kvs_handle *)complete_delete_test;
  deleted_doc_stat_test();
  pfStack_11748 = (fdb_kvs_handle *)0x110b81;
  pfStack_112e8 = pfVar10;
  pfStack_112e0 = unaff_R12;
  pfStack_112d8 = handle_00;
  pfStack_112d0 = (fdb_config *)pcVar4;
  pfStack_112c8 = unaff_R15;
  pfStack_112c0 = unaff_RBP;
  gettimeofday(&tStack_11718,(__timezone_ptr_t)0x0);
  pfStack_11748 = (fdb_kvs_handle *)0x110b86;
  memleak_start();
  pcVar4 = acStack_113f0;
  builtin_strncpy(acStack_113f0,"./dummy1",9);
  pfStack_11748 = (fdb_kvs_handle *)0x110bab;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar10 = &fStack_114e8;
  pfStack_11748 = (fdb_kvs_handle *)0x110bbb;
  fdb_get_default_config();
  fStack_114e8.buffercache_size = 0;
  kvs_config_00 = &fStack_11708.create_if_missing;
  pfStack_11748 = (fdb_kvs_handle *)0x110bd0;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_11728;
  pfStack_11748 = (fdb_kvs_handle *)0x110be3;
  fdb_open(ptr_fhandle,pcVar4,pfVar10);
  pfStack_11748 = (fdb_kvs_handle *)0x110bfb;
  fVar2 = fdb_kvs_open(pfStack_11728,&pfStack_11730,"db1",(fdb_kvs_config *)kvs_config_00);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d95;
  unaff_RBP = (fdb_kvs_handle *)0x0;
  do {
    pfStack_11748 = (fdb_kvs_handle *)0x110c2c;
    sprintf((char *)&fStack_115f0,"key%05d",unaff_RBP);
    pfStack_11748 = (fdb_kvs_handle *)0x110c3b;
    sprintf((char *)apfStack_116f0,"value%05d",unaff_RBP);
    handle_00 = pfStack_11730;
    pfStack_11748 = (fdb_kvs_handle *)0x110c48;
    sVar5 = strlen((char *)&fStack_115f0);
    pcVar4 = (char *)(sVar5 + 1);
    pfStack_11748 = (fdb_kvs_handle *)0x110c54;
    sVar5 = strlen((char *)apfStack_116f0);
    pfStack_11748 = (fdb_kvs_handle *)0x110c69;
    fVar2 = fdb_set_kv(handle_00,&fStack_115f0,(size_t)pcVar4,apfStack_116f0,sVar5 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_11748 = (fdb_kvs_handle *)0x110d90;
      complete_delete_test();
      goto LAB_00110d90;
    }
    uVar11 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_kvs_handle *)(ulong)uVar11;
  } while (uVar11 != 1000);
  pfStack_11748 = (fdb_kvs_handle *)0x110c8a;
  fdb_commit(pfStack_11728,'\x01');
  pcVar4 = "key%05d";
  pfVar10 = &fStack_115f0;
  kvs_config_00 = "value%05d";
  ptr_fhandle = apfStack_116f0;
  unaff_RBP = (fdb_kvs_handle *)0x0;
  do {
    pfStack_11748 = (fdb_kvs_handle *)0x110cb6;
    sprintf((char *)pfVar10,"key%05d",unaff_RBP);
    pfStack_11748 = (fdb_kvs_handle *)0x110cc5;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    handle_00 = pfStack_11730;
    pfStack_11748 = (fdb_kvs_handle *)0x110cd2;
    sVar5 = strlen((char *)pfVar10);
    pfStack_11748 = (fdb_kvs_handle *)0x110ce1;
    fVar2 = fdb_del_kv(handle_00,pfVar10,sVar5 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d90;
    uVar11 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_kvs_handle *)(ulong)uVar11;
  } while (uVar11 != 1000);
  pfStack_11748 = (fdb_kvs_handle *)0x110d02;
  fdb_commit(pfStack_11728,'\x01');
  pfStack_11748 = (fdb_kvs_handle *)0x110d22;
  fVar2 = fdb_iterator_init(pfStack_11730,&pfStack_11720,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9a;
  pfStack_11748 = (fdb_kvs_handle *)0x110d30;
  fVar2 = fdb_iterator_close(pfStack_11720);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11748 = (fdb_kvs_handle *)0x110d3e;
    fdb_close(pfStack_11728);
    pfStack_11748 = (fdb_kvs_handle *)0x110d43;
    fdb_shutdown();
    pfStack_11748 = (fdb_kvs_handle *)0x110d48;
    memleak_end();
    pcVar4 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar4 = "%s FAILED\n";
    }
    pfStack_11748 = (fdb_kvs_handle *)0x110d79;
    fprintf(_stderr,pcVar4,"complete delete");
    return;
  }
  goto LAB_00110d9f;
LAB_00110d90:
  pfVar10 = &fStack_115f0;
  ptr_fhandle = apfStack_116f0;
  kvs_config_00 = "value%05d";
  pfStack_11748 = (fdb_kvs_handle *)0x110d95;
  complete_delete_test();
LAB_00110d95:
  pfStack_11748 = (fdb_kvs_handle *)0x110d9a;
  complete_delete_test();
LAB_00110d9a:
  pfStack_11748 = (fdb_kvs_handle *)0x110d9f;
  complete_delete_test();
LAB_00110d9f:
  pfStack_11748 = (fdb_kvs_handle *)large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_11bc0 = (fdb_config *)0x110dc1;
  pcStack_11770 = pcVar4;
  ppfStack_11768 = ptr_fhandle;
  pfStack_11760 = handle_00;
  pfStack_11758 = pfVar10;
  pfStack_11750 = (fdb_kvs_config *)kvs_config_00;
  pfStack_11748 = unaff_RBP;
  gettimeofday(&tStack_11b88,(__timezone_ptr_t)0x0);
  pfStack_11bc0 = (fdb_config *)0x110dc6;
  memleak_start();
  pfStack_11bc0 = (fdb_config *)0x110dd0;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_11bc0 = (fdb_config *)0x110ddf;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar10 = &fStack_11a70;
  pfStack_11bc0 = (fdb_config *)0x110def;
  fdb_get_default_config();
  pfStack_11bc0 = (fdb_config *)0x110df9;
  fdb_get_default_kvs_config();
  pfStack_11bc0 = (fdb_config *)0x110e0d;
  fVar2 = fdb_open(&pfStack_11bb0,"./dummy1",pfVar10);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11bc0 = (fdb_config *)0x110e2b;
    fVar2 = fdb_kvs_open(pfStack_11bb0,&pfStack_11ba8,(char *)0x0,&fStack_11ba0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb0;
    pcVar4 = (char *)0x0;
    uVar8 = 0;
    do {
      pfStack_11bc0 = (fdb_config *)0x110e54;
      sprintf(acStack_11878,"key%128d",uVar8 & 0xffffffff);
      pfStack_11bc0 = (fdb_config *)0x110e70;
      sprintf(acStack_11978,"meta%128d",uVar8 & 0xffffffff);
      pfStack_11bc0 = (fdb_config *)0x110e86;
      sprintf(acStack_11b78,"body%128d",uVar8 & 0xffffffff);
      pfStack_11bc0 = (fdb_config *)0x110e92;
      sVar5 = strlen(acStack_11878);
      pfStack_11bc0 = (fdb_config *)0x110ea0;
      sVar6 = strlen(acStack_11978);
      pfStack_11bc0 = (fdb_config *)0x110ead;
      bodylen = strlen(acStack_11b78);
      pfStack_11bc0 = (fdb_config *)0x110ed7;
      fdb_doc_create((fdb_doc **)(pcVar4 + (long)&__ptr->chunksize),acStack_11878,sVar5,
                     acStack_11978,sVar6,acStack_11b78,bodylen);
      pfStack_11bc0 = (fdb_config *)0x110ee5;
      fdb_set(pfStack_11ba8,*(fdb_doc **)(&__ptr->chunksize + uVar8 * 4));
      pfStack_11bc0 = (fdb_config *)0x110eee;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar8 * 4));
      uVar8 = uVar8 + 1;
      pcVar4 = pcVar4 + 8;
    } while (uVar8 != 500000);
    pfStack_11bc0 = (fdb_config *)0x110f0c;
    fVar2 = fdb_kvs_close(pfStack_11ba8);
    pfVar10 = __ptr;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb5;
    pfStack_11bc0 = (fdb_config *)0x110f1e;
    fVar2 = fdb_close(pfStack_11bb0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fba;
    pfStack_11bc0 = (fdb_config *)0x110f3f;
    fVar2 = fdb_open(&pfStack_11bb0,"./dummy1",&fStack_11a70);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f56:
      pfStack_11bc0 = (fdb_config *)0x110f5e;
      free(__ptr);
      pfStack_11bc0 = (fdb_config *)0x110f63;
      fdb_shutdown();
      pfStack_11bc0 = (fdb_config *)0x110f68;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_11bc0 = (fdb_config *)0x110f99;
      fprintf(_stderr,pcVar4,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_11bc0 = (fdb_config *)0x110f52;
      fVar2 = fdb_close(pfStack_11bb0);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f56;
      goto LAB_00110fc4;
    }
  }
  else {
    pfStack_11bc0 = (fdb_config *)0x110fb0;
    large_batch_write_no_commit_test();
LAB_00110fb0:
    pfStack_11bc0 = (fdb_config *)0x110fb5;
    large_batch_write_no_commit_test();
LAB_00110fb5:
    pfStack_11bc0 = (fdb_config *)0x110fba;
    large_batch_write_no_commit_test();
LAB_00110fba:
    pfStack_11bc0 = (fdb_config *)0x110fbf;
    large_batch_write_no_commit_test();
  }
  pfStack_11bc0 = (fdb_config *)0x110fc4;
  large_batch_write_no_commit_test();
LAB_00110fc4:
  pfStack_11bc0 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_11bd0 = pcVar4;
  pfStack_11bc8 = pfVar10;
  pfStack_11bc0 = __ptr;
  gettimeofday(&tStack_11df0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_11dc8.wal_threshold = 0x400;
  fStack_11dc8.seqtree_opt = '\x01';
  fStack_11dc8.purging_interval = 1;
  fStack_11dc8.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_11df8,"./dummy1",&fStack_11dc8);
  fdb_kvs_open(pfStack_11df8,&pfStack_11e00,"db1",&fStack_11de0);
  sprintf(acStack_11cd0,"key%d",0);
  sVar5 = strlen(acStack_11cd0);
  fdb_doc_create(&pfStack_11e08,acStack_11cd0,sVar5,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_11e00,pfStack_11e08);
  fVar2 = fdb_get(pfStack_11e00,pfStack_11e08);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_11e00,pfStack_11e08);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_11e00,pfStack_11e08);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_11e00,pfStack_11e08);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_11e00,pfStack_11e08);
        fVar2 = fdb_get(pfStack_11e00,pfStack_11e08);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_11e08->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_11e00,pfStack_11e08);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x353,"void set_get_meta_test()");
          }
          if (pfStack_11e08->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x354,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly_byseq(pfStack_11e00,pfStack_11e08);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_11e08->deleted != false) {
              fVar2 = fdb_get_byoffset(pfStack_11e00,pfStack_11e08);
              if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                if (pfStack_11e08->deleted != false) {
                  fdb_doc_free(pfStack_11e08);
                  fdb_kvs_close(pfStack_11e00);
                  fdb_close(pfStack_11df8);
                  fdb_shutdown();
                  memleak_end();
                  pcVar4 = "%s PASSED\n";
                  if (set_get_meta_test()::__test_pass != '\0') {
                    pcVar4 = "%s FAILED\n";
                  }
                  fprintf(_stderr,pcVar4,"set get meta test");
                  return;
                }
              }
              else {
                set_get_meta_test();
              }
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x35c,"void set_get_meta_test()");
            }
          }
          else {
            set_get_meta_test();
          }
          __assert_fail("rdoc->deleted == true",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x358,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void basic_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_rdonly;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_rdonly;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy test files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    // Get the ForestDB version
    const char *version = fdb_get_lib_version();
    TEST_CHK(version != NULL && strlen(version) > 0);

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1;

    // Read-Write mode test without a create flag.
    fconfig.flags = 0;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);
    TEST_CHK(!strcmp(fdb_error_msg(status), "no such file"));

    // Read-Only mode test: Must not create new file.
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Read-Only and Create mode: Must not create a new file.
    fconfig.flags = FDB_OPEN_FLAG_RDONLY | FDB_OPEN_FLAG_CREATE;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);
    TEST_CHK(!strcmp(fdb_error_msg(status), "invalid configuration"));

    // open and close db with a create flag.
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(!strcmp(fdb_error_msg(status), "success"));
    const char *file_version = fdb_get_file_version(dbfile);
    TEST_CHK(file_version != NULL && strlen(file_version) > 0);
    fdb_close(dbfile);

    // reopen db
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./dummy1",&fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc, (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta,
                   doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // check the file info
    fdb_file_info info;
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 9);
    TEST_CHK(info.deleted_count == 1);
    TEST_CHK(info.space_used > 0);
    TEST_CHK(info.num_kv_stores == 1);

    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, NULL, 0, NULL, 0);
    status = fdb_get_metaonly(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(rdoc->deleted == true);
    TEST_CMP(rdoc->meta, doc[5]->meta, rdoc->metalen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc, (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update document #0 and #1
    for (i=0;i<2;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
            TEST_CHK(!strcmp(fdb_error_msg(status), "key not found"));
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // retrieve documents by sequence number
    for (i=0; i < n+3; ++i){
        // search by seq
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->seqnum = i + 1;
        status = fdb_get_byseq(db, rdoc);
        if ( (i>=2 && i<=4) || (i>=6 && i<=9) || (i>=11 && i<=12)) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // update document #5 with an empty doc body.
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta,
                   doc[5]->metalen, NULL, 0);
    status = fdb_set(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Check document #5 with respect to metadata and doc body.
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(memcmp(rdoc->meta, doc[5]->meta, rdoc->metalen) == 0);
    TEST_CHK(rdoc->body == NULL);
    TEST_CHK(rdoc->bodylen == 0);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // Read-Only mode test: Open succeeds if file exists, but disallow writes
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile_rdonly, "./dummy2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_rdonly, &db_rdonly, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_create(&rdoc, doc[0]->key, doc[0]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db_rdonly, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db_rdonly, logCallbackFunc,
                                  (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db_rdonly, doc[i]);
    TEST_CHK(status == FDB_RESULT_RONLY_VIOLATION);
    TEST_CHK(!strcmp(fdb_error_msg(status), "database is read-only"));

    status = fdb_commit(dbfile_rdonly, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_RONLY_VIOLATION);

    fdb_doc_free(rdoc);
    rdoc = NULL;
    fdb_kvs_close(db_rdonly);
    fdb_close(dbfile_rdonly);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // do one more compaction
    fdb_compact(dbfile, (char *) "./dummy3");

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("basic test");
}